

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::ExtensionDescriptorTest_FieldVsExtension_Test::
~ExtensionDescriptorTest_FieldVsExtension_Test(ExtensionDescriptorTest_FieldVsExtension_Test *this)

{
  ExtensionDescriptorTest::~ExtensionDescriptorTest(&this->super_ExtensionDescriptorTest);
  operator_delete(this,0xb0);
  return;
}

Assistant:

TEST_F(ExtensionDescriptorTest, FieldVsExtension) {
  EXPECT_EQ(foo_->FindFieldByName("foo_message"), nullptr);
  EXPECT_EQ(bar_->FindFieldByName("foo_message"), nullptr);
  EXPECT_NE(bar_->FindFieldByName("non_ext_int32"), nullptr);
  EXPECT_EQ(foo_->FindExtensionByName("foo_message"), nullptr);
  EXPECT_NE(bar_->FindExtensionByName("foo_message"), nullptr);
  EXPECT_EQ(bar_->FindExtensionByName("non_ext_int32"), nullptr);
}